

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test>
::~ParameterizedTestFactory
          (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_018e8358;
  pcVar2 = (this->parameter_).test_name._M_dataplus._M_p;
  paVar1 = &(this->parameter_).test_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}